

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::Do(TCPSocket *this)

{
  Poller *this_00;
  bool bVar1;
  int iVar2;
  _Manager_operation extraout_EDX;
  iterator __position;
  mutex *__mutex;
  int iVar3;
  byte bVar4;
  void *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  _List_node_base *local_68;
  undefined1 auStack_60 [8];
  value_type front;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    front._M_invoker = (_Invoker_type)&this->closures;
    local_68 = (_List_node_base *)&this->recvList;
    iVar3 = 0xb;
    do {
      if (*(_Invoker_type *)front._M_invoker != front._M_invoker) {
        std::function<void_()>::function
                  ((function<void_()> *)auStack_60,
                   (function<void_()> *)(*(_Invoker_type *)front._M_invoker + 0x10));
        __position._M_node = *(_List_node_base **)front._M_invoker;
        std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_erase((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                 front._M_invoker,__position);
        if (front.super__Function_base._M_functor._8_8_ == 0) {
          std::__throw_bad_function_call();
        }
        (*front.super__Function_base._M_manager)
                  ((_Any_data *)auStack_60,(_Any_data *)__position._M_node,extraout_EDX);
        if (front.super__Function_base._M_functor._8_8_ != 0) {
          (*(code *)front.super__Function_base._M_functor._8_8_)
                    ((_Any_data *)auStack_60,(_Any_data *)auStack_60,3);
        }
      }
      if ((this->readable == true) &&
         ((this->recvList).
          super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != local_68)) {
        bVar1 = canWrite(this);
        bVar4 = 1;
      }
      else {
        bVar4 = this->socketError;
        bVar1 = canWrite(this);
        if ((bVar1 | bVar4) != 1) goto LAB_00116c36;
      }
      if (((this->closed)._M_base._M_i & 1U) != 0) {
LAB_00116c36:
        if (((this->closed)._M_base._M_i & 1U) == 0) {
          this->doing = false;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          doClose(this);
        }
        return;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        this_00 = this->poller_;
        std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPSocket,void>
                  ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPSocket>);
        auStack_60 = (undefined1  [8])local_78;
        front.super__Function_base._M_functor._M_unused._M_object = p_Stack_70;
        local_78 = (void *)0x0;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Poller::PostTask(this_00,(Ptr *)auStack_60,this->pool_);
        if (front.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     front.super__Function_base._M_functor._M_unused._0_8_);
        }
        if (p_Stack_70 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
        return;
      }
      if (bVar4 != 0) {
        recvInWorker(this);
      }
      if (bVar1 != false) {
        sendInWorker(this);
      }
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    } while (iVar2 == 0);
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TCPSocket::Do() {
	static const int maxLoop = 10;
	auto doClose = false;	
	//this->tid = std::this_thread::get_id();
	auto i = 0;
	for( ;;i++) {
		this->mtx.lock();
		if(!this->closures.empty()) {
			auto front = this->closures.front();
			this->closures.pop_front();
			front();
		}

		auto canRead_ = canRead();
		auto canWrite_ = canWrite();
		if(!(canRead_ || canWrite_) || this->closed) {
			if(!closed) {
				this->doing =false;
			} else {
				doClose = true;
			}
			this->mtx.unlock();
			if(doClose){
				this->doClose();
			}
			//this->tid = std::thread::id();
			return;
		}
		this->mtx.unlock();
		if(i >= maxLoop){
			//执行次数过多了，暂停一下，将cpu让给其它任务执行
			//this->tid = std::thread::id();
			poller_->PostTask(shared_from_this(),this->pool_);
			return;
		} else {


			if(canRead_){
				recvInWorker();
			}

#ifdef USE_SSL
			if(canWrite_){
				sendInWorkerSSL();
			}
#else
			if(canWrite_){
				sendInWorker();
			}
#endif

		}
	}
}